

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz-test.cpp
# Opt level: O0

void __thiscall test_butter::test_method(test_butter *this)

{
  undefined8 uVar1;
  iterator pvVar2;
  bool bVar3;
  lazy_ostream *plVar4;
  iterator pvVar5;
  double local_3c0;
  basic_cstring<const_char> local_3b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_3a8;
  basic_cstring<const_char> local_380;
  basic_cstring<const_char> local_370;
  difference_type local_360;
  difference_type local_358;
  basic_cstring<const_char> local_350;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_340;
  basic_cstring<const_char> local_318;
  basic_cstring<const_char> local_308;
  iterator local_2f8;
  iterator b_1;
  iterator ae_1;
  iterator a_1;
  basic_cstring<const_char> local_2d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_2c8;
  basic_cstring<const_char> local_2a0;
  basic_cstring<const_char> local_290;
  difference_type local_280;
  difference_type local_278;
  basic_cstring<const_char> local_270;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_260;
  basic_cstring<const_char> local_238;
  basic_cstring<const_char> local_228;
  iterator local_218;
  iterator b;
  iterator ae;
  iterator a;
  basic_cstring<const_char> local_1e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1d8;
  basic_cstring<const_char> local_1b0;
  basic_cstring<const_char> local_1a0;
  tuple<double_&,_std::array<double,_7UL>_&,_std::array<double,_7UL>_&> local_190;
  tuple<double,_std::array<double,_7UL>,_std::array<double,_7UL>_> local_178;
  undefined1 local_100 [8];
  array<double,_7UL> actual_a;
  array<double,_7UL> actual_b;
  double actual_gain;
  array<double,_7UL> expected_a;
  array<double,_7UL> expected_b;
  double expected_gain;
  test_butter *this_local;
  
  expected_b._M_elems[6] = 2.18780328998614e-06;
  memcpy(expected_a._M_elems + 6,&DAT_001361a0,0x38);
  memcpy(&actual_gain,&DAT_001361d8,0x38);
  butter_lp<6>(&local_178,2048000.0,80000.0);
  std::tie<double,std::array<double,7ul>,std::array<double,7ul>>
            (&local_190,actual_b._M_elems + 6,(array<double,_7UL> *)(actual_a._M_elems + 6),
             (array<double,_7UL> *)local_100);
  std::tuple<double&,std::array<double,7ul>&,std::array<double,7ul>&>::operator=
            ((tuple<double&,std::array<double,7ul>&,std::array<double,7ul>&> *)&local_190,&local_178
            );
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp"
               ,0x57);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1a0,0x27,&local_1b0);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1d8,plVar4,(char (*) [1])0x136a06);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp"
               ,0x57);
    a = (iterator)boost::math::fpc::percent_tolerance<double>(1e-12);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (&local_1d8,&local_1e8,0x27,1,8,expected_b._M_elems + 6,"expected_gain",
               actual_b._M_elems + 6,"actual_gain",&a,"::boost::math::fpc::percent_tolerance(1e-12)"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1d8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  ae = std::begin<std::array<double,7ul>>((array<double,_7UL> *)(expected_a._M_elems + 6));
  b = std::end<std::array<double,7ul>>((array<double,_7UL> *)(expected_a._M_elems + 6));
  local_218 = std::begin<std::array<double,7ul>>((array<double,_7UL> *)(actual_a._M_elems + 6));
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp"
               ,0x57);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_238);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_228,0x28,&local_238);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_260,plVar4,(char (*) [1])0x136a06);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp"
               ,0x57);
    local_278 = std::distance<double*>(ae,b);
    pvVar2 = local_218;
    pvVar5 = std::end<std::array<double,7ul>>((array<double,_7UL> *)(actual_a._M_elems + 6));
    local_280 = std::distance<double*>(pvVar2,pvVar5);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_260,&local_270,0x28,2,2,&local_278,"distance(a, ae)",&local_280,
               "distance(b, end(actual_b))");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_260);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  for (; ae != b; ae = ae + 1) {
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_290,
                 "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp"
                 ,0x57);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2a0);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_290,0x28,&local_2a0);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(&local_2c8,plVar4,(char (*) [1])0x136a06);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_2d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp"
                 ,0x57);
      pvVar5 = ae;
      pvVar2 = local_218;
      a_1 = (iterator)boost::math::fpc::percent_tolerance<double>(1e-12);
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
                (&local_2c8,&local_2d8,0x28,1,8,pvVar5,"*a",pvVar2,"*b",&a_1,
                 "::boost::math::fpc::percent_tolerance(1e-12)");
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl(&local_2c8);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    local_218 = local_218 + 1;
  }
  ae_1 = std::begin<std::array<double,7ul>>((array<double,_7UL> *)&actual_gain);
  b_1 = std::end<std::array<double,7ul>>((array<double,_7UL> *)&actual_gain);
  local_2f8 = std::begin<std::array<double,7ul>>((array<double,_7UL> *)local_100);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_308,
               "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp"
               ,0x57);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_318);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_308,0x29,&local_318);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_340,plVar4,(char (*) [1])0x136a06);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_350,
               "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp"
               ,0x57);
    local_358 = std::distance<double*>(ae_1,b_1);
    pvVar2 = local_2f8;
    pvVar5 = std::end<std::array<double,7ul>>((array<double,_7UL> *)local_100);
    local_360 = std::distance<double*>(pvVar2,pvVar5);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_340,&local_350,0x29,2,2,&local_358,"distance(a, ae)",&local_360,
               "distance(b, end(actual_a))");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_340);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  for (; ae_1 != b_1; ae_1 = ae_1 + 1) {
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_370,
                 "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp"
                 ,0x57);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_380);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_370,0x29,&local_380);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(&local_3a8,plVar4,(char (*) [1])0x136a06);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_3b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp"
                 ,0x57);
      pvVar5 = ae_1;
      pvVar2 = local_2f8;
      local_3c0 = (double)boost::math::fpc::percent_tolerance<double>(1e-12);
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
                (&local_3a8,&local_3b8,0x29,1,8,pvVar5,"*a",pvVar2,"*b",&local_3c0,
                 "::boost::math::fpc::percent_tolerance(1e-12)");
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl(&local_3a8);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    local_2f8 = local_2f8 + 1;
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_butter)
{
    // generated with octave signal package
    // > pkg load signal
    // > [b,a] = butter(6, 2*80000/2048000)
    double expected_gain = 2.18780328998614e-06;
    std::array<double, 7> expected_b({ 1, 6, 15, 20, 15, 6, 1 });
    std::array<double, 7> expected_a(
      { 1, -5.052163948341672, 10.699633740567215, -12.151435255115082,
        7.801326239249508, -2.683448745937741, 0.386227988988330 });

    double actual_gain;
    std::array<double, 7 > actual_b;
    std::array<double, 7 > actual_a;

    std::tie(actual_gain, actual_b, actual_a) = butter_lp<6>(2048000, 80000);

    BOOST_CHECK_CLOSE(expected_gain, actual_gain, 1e-12);
    CHECK_CLOSE_COLLECTION(expected_b, actual_b, 1e-12);
    CHECK_CLOSE_COLLECTION(expected_a, actual_a, 1e-12);
}